

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

xmlDictEntry *
xmlDictFindEntry(xmlDict *dict,xmlChar *prefix,xmlChar *name,int len,uint hashValue,int *pfound)

{
  xmlChar *str;
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  xmlDictEntry *pxVar5;
  uint uVar6;
  
  uVar6 = (int)dict->size - 1;
  uVar4 = uVar6 & hashValue;
  pxVar5 = dict->table + uVar4;
  uVar1 = dict->table[uVar4].hashValue;
  if (uVar1 == 0) {
    iVar2 = 0;
LAB_0012be3d:
    *pfound = iVar2;
    return pxVar5;
  }
  uVar3 = 0;
  do {
    uVar4 = uVar4 + 1;
    if (uVar1 == hashValue) {
      str = pxVar5->name;
      if (prefix == (xmlChar *)0x0) {
        iVar2 = strncmp((char *)str,(char *)name,(ulong)(uint)len);
        if ((iVar2 == 0) && (str[(uint)len] == '\0')) goto LAB_0012be38;
      }
      else {
        iVar2 = xmlStrQEqual(prefix,name,str);
        if (iVar2 != 0) {
LAB_0012be38:
          iVar2 = 1;
          goto LAB_0012be3d;
        }
      }
    }
    if ((uVar4 & uVar6) == 0) {
      pxVar5 = dict->table;
    }
    else {
      pxVar5 = pxVar5 + 1;
    }
    uVar1 = pxVar5->hashValue;
    iVar2 = 0;
    if ((uVar1 == 0) || (uVar3 = uVar3 + 1, (uVar4 - uVar1 & uVar6) < uVar3)) goto LAB_0012be3d;
  } while( true );
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static xmlDictEntry *
xmlDictFindEntry(const xmlDict *dict, const xmlChar *prefix,
                 const xmlChar *name, int len, unsigned hashValue,
                 int *pfound) {
    xmlDictEntry *entry;
    unsigned mask, pos, displ;
    int found = 0;

    mask = dict->size - 1;
    pos = hashValue & mask;
    entry = &dict->table[pos];

    if (entry->hashValue != 0) {
        /*
         * Robin hood hashing: abort if the displacement of the entry
         * is smaller than the displacement of the key we look for.
         * This also stops at the correct position when inserting.
         */
        displ = 0;

        do {
            if (entry->hashValue == hashValue) {
                if (prefix == NULL) {
                    /*
                     * name is not necessarily null-terminated.
                     */
                    if ((strncmp((const char *) entry->name,
                                 (const char *) name, len) == 0) &&
                        (entry->name[len] == 0)) {
                        found = 1;
                        break;
                    }
                } else {
                    if (xmlStrQEqual(prefix, name, entry->name)) {
                        found = 1;
                        break;
                    }
                }
            }

            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = dict->table;
        } while ((entry->hashValue != 0) &&
                 (((pos - entry->hashValue) & mask) >= displ));
    }

    *pfound = found;
    return(entry);
}